

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha-1.c
# Opt level: O0

void sha1_pad(sha1_ctxt *ctxt)

{
  long local_20;
  size_t padstart;
  size_t padlen;
  sha1_ctxt *ctxt_local;
  
  (ctxt->m).b8[(int)((uint)ctxt->count % 0x40)] = 0x80;
  ctxt->count = ctxt->count + '\x01';
  ctxt->count = ctxt->count % 0x40;
  if ((uint)ctxt->count % 0x40 == 0) {
    sha1_step(ctxt);
  }
  local_20 = (long)(int)((uint)ctxt->count % 0x40);
  padstart = 0x40 - local_20;
  if (padstart < 8) {
    memset((void *)((long)&ctxt->m + local_20),0,padstart);
    ctxt->count = ctxt->count + (char)padstart;
    ctxt->count = ctxt->count % 0x40;
    sha1_step(ctxt);
    local_20 = (long)(int)((uint)ctxt->count % 0x40);
    padstart = 0x40 - local_20;
  }
  memset((void *)((long)&ctxt->m + local_20),0,padstart - 8);
  ctxt->count = ctxt->count + (char)padstart + -8;
  ctxt->count = ctxt->count % 0x40;
  (ctxt->m).b8[(int)((uint)ctxt->count % 0x40)] = (ctxt->c).b8[7];
  ctxt->count = ctxt->count + '\x01';
  ctxt->count = ctxt->count % 0x40;
  if ((uint)ctxt->count % 0x40 == 0) {
    sha1_step(ctxt);
  }
  (ctxt->m).b8[(int)((uint)ctxt->count % 0x40)] = (ctxt->c).b8[6];
  ctxt->count = ctxt->count + '\x01';
  ctxt->count = ctxt->count % 0x40;
  if ((uint)ctxt->count % 0x40 == 0) {
    sha1_step(ctxt);
  }
  (ctxt->m).b8[(int)((uint)ctxt->count % 0x40)] = (ctxt->c).b8[5];
  ctxt->count = ctxt->count + '\x01';
  ctxt->count = ctxt->count % 0x40;
  if ((uint)ctxt->count % 0x40 == 0) {
    sha1_step(ctxt);
  }
  (ctxt->m).b8[(int)((uint)ctxt->count % 0x40)] = (ctxt->c).b8[4];
  ctxt->count = ctxt->count + '\x01';
  ctxt->count = ctxt->count % 0x40;
  if ((uint)ctxt->count % 0x40 == 0) {
    sha1_step(ctxt);
  }
  (ctxt->m).b8[(int)((uint)ctxt->count % 0x40)] = (ctxt->c).b8[3];
  ctxt->count = ctxt->count + '\x01';
  ctxt->count = ctxt->count % 0x40;
  if ((uint)ctxt->count % 0x40 == 0) {
    sha1_step(ctxt);
  }
  (ctxt->m).b8[(int)((uint)ctxt->count % 0x40)] = (ctxt->c).b8[2];
  ctxt->count = ctxt->count + '\x01';
  ctxt->count = ctxt->count % 0x40;
  if ((uint)ctxt->count % 0x40 == 0) {
    sha1_step(ctxt);
  }
  (ctxt->m).b8[(int)((uint)ctxt->count % 0x40)] = (ctxt->c).b8[1];
  ctxt->count = ctxt->count + '\x01';
  ctxt->count = ctxt->count % 0x40;
  if ((uint)ctxt->count % 0x40 == 0) {
    sha1_step(ctxt);
  }
  (ctxt->m).b8[(int)((uint)ctxt->count % 0x40)] = (ctxt->c).b8[0];
  ctxt->count = ctxt->count + '\x01';
  ctxt->count = ctxt->count % 0x40;
  if ((uint)ctxt->count % 0x40 == 0) {
    sha1_step(ctxt);
  }
  return;
}

Assistant:

void
sha1_pad(struct sha1_ctxt *ctxt)
{
	size_t padlen;		/*pad length in bytes*/
	size_t padstart;

	PUTPAD(0x80);

	padstart = COUNT % 64;
	padlen = 64 - padstart;
	if (padlen < 8) {
		memset(&ctxt->m.b8[padstart], 0, padlen);
		COUNT = (unsigned char)(COUNT + padlen);
		COUNT %= 64;
		sha1_step(ctxt);
		padstart = COUNT % 64;	/* should be 0 */
		padlen = 64 - padstart;	/* should be 64 */
	}
	memset(&ctxt->m.b8[padstart], 0, padlen - 8);
	COUNT = (unsigned char)(COUNT + (padlen - 8));
	COUNT %= 64;
#if BYTE_ORDER == BIG_ENDIAN
	PUTPAD(ctxt->c.b8[0]); PUTPAD(ctxt->c.b8[1]);
	PUTPAD(ctxt->c.b8[2]); PUTPAD(ctxt->c.b8[3]);
	PUTPAD(ctxt->c.b8[4]); PUTPAD(ctxt->c.b8[5]);
	PUTPAD(ctxt->c.b8[6]); PUTPAD(ctxt->c.b8[7]);
#else
	PUTPAD(ctxt->c.b8[7]); PUTPAD(ctxt->c.b8[6]);
	PUTPAD(ctxt->c.b8[5]); PUTPAD(ctxt->c.b8[4]);
	PUTPAD(ctxt->c.b8[3]); PUTPAD(ctxt->c.b8[2]);
	PUTPAD(ctxt->c.b8[1]); PUTPAD(ctxt->c.b8[0]);
#endif
}